

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O3

Abc_Ntk_t * Acb_NtkToAbc(Abc_Ntk_t *pNtk,Acb_Ntk_t *p)

{
  uint uVar1;
  Mem_Flex_t *pMan;
  Vec_Ptr_t *pVVar2;
  int *piVar3;
  int iVar4;
  Abc_Ntk_t *pNtk_00;
  Vec_Int_t *vCover;
  int *piVar5;
  long lVar6;
  Abc_Obj_t *pAVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pMan = (Mem_Flex_t *)pNtk_00->pManFunc;
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 1000;
  vCover->nSize = 0;
  piVar5 = (int *)malloc(4000);
  vCover->pArray = piVar5;
  uVar9 = (p->vObjType).nCap;
  if ((p->vObjCopy).nCap < (int)uVar9) {
    piVar5 = (p->vObjCopy).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar9 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar9 << 2);
    }
    (p->vObjCopy).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vObjCopy).nCap = uVar9;
  }
  if (0 < (int)uVar9) {
    memset((p->vObjCopy).pArray,0xff,(ulong)uVar9 * 4);
  }
  (p->vObjCopy).nSize = uVar9;
  if (0 < (p->vCis).nSize) {
    piVar5 = (p->vCis).pArray;
    pVVar2 = pNtk_00->vCis;
    lVar11 = 0;
    do {
      if (pVVar2->nSize <= lVar11) goto LAB_0036ae3d;
      uVar9 = piVar5[lVar11];
      if ((int)uVar9 < 1) goto LAB_0036aea3;
      uVar1 = (p->vObjCopy).nSize;
      if ((int)uVar1 < 1) goto LAB_0036ae9a;
      if (uVar1 <= uVar9) goto LAB_0036ae5c;
      piVar3 = (p->vObjCopy).pArray;
      if (piVar3[uVar9] != -1) goto LAB_0036aee1;
      piVar3[uVar9] = *(int *)((long)pVVar2->pArray[lVar11] + 0x10);
      lVar11 = lVar11 + 1;
    } while (lVar11 < (p->vCis).nSize);
  }
  iVar4 = (p->vObjType).nSize;
  if (1 < iVar4) {
    uVar12 = 1;
    lVar11 = 8;
    do {
      lVar6 = (long)iVar4;
      if (lVar6 <= (long)uVar12) goto LAB_0036aec2;
      uVar9 = (uint)(byte)(p->vObjType).pArray[uVar12];
      if ((4 < uVar9) || ((0x19U >> (uVar9 & 0x1f) & 1) == 0)) {
        pAVar7 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
        if ((long)(p->vObjFans).nSize <= (long)uVar12) goto LAB_0036ae5c;
        iVar4 = (p->vObjFans).pArray[uVar12];
        if (((long)iVar4 < 0) || ((p->vFanSto).nSize <= iVar4)) goto LAB_0036ae7b;
        uVar10 = (ulong)(p->vObjTruth).nSize;
        if ((long)uVar10 < 1) {
          __assert_fail("Acb_NtkHasObjTruths(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                        ,0x10c,"word *Acb_ObjTruthP(Acb_Ntk_t *, int)");
        }
        if (uVar10 <= uVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pcVar8 = Abc_SopCreateFromTruthIsop
                           (pMan,(p->vFanSto).pArray[iVar4],
                            (word *)((long)(p->vObjTruth).pArray + lVar11),vCover);
        (pAVar7->field_5).pData = pcVar8;
        uVar10 = (ulong)(p->vObjCopy).nSize;
        if ((long)uVar10 < 1) goto LAB_0036ae9a;
        if (uVar10 <= uVar12) goto LAB_0036ae5c;
        piVar5 = (p->vObjCopy).pArray;
        if (piVar5[uVar12] != -1) {
LAB_0036aee1:
          __assert_fail("Acb_ObjCopy(p, i) == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                        ,0x11a,"void Acb_ObjSetCopy(Acb_Ntk_t *, int, int)");
        }
        piVar5[uVar12] = pAVar7->Id;
        iVar4 = (p->vObjType).nSize;
        lVar6 = (long)iVar4;
      }
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 8;
    } while ((long)uVar12 < lVar6);
  }
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
    iVar4 = (p->vObjType).nSize;
  }
  free(vCover);
  if (1 < iVar4) {
    uVar12 = 1;
    do {
      lVar11 = (long)iVar4;
      if (lVar11 <= (long)uVar12) {
LAB_0036aec2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      uVar9 = (uint)(byte)(p->vObjType).pArray[uVar12];
      if ((4 < uVar9) || ((0x19U >> (uVar9 & 0x1f) & 1) == 0)) {
        uVar10 = (ulong)(p->vObjCopy).nSize;
        if ((long)uVar10 < 1) goto LAB_0036ae9a;
        if (uVar10 <= uVar12) goto LAB_0036ae5c;
        iVar4 = (p->vObjCopy).pArray[uVar12];
        if (((long)iVar4 < 0) || (pNtk_00->vObjs->nSize <= iVar4)) goto LAB_0036ae3d;
        if ((long)(p->vObjFans).nSize <= (long)uVar12) goto LAB_0036ae5c;
        pAVar7 = (Abc_Obj_t *)pNtk_00->vObjs->pArray[iVar4];
        lVar11 = 0;
        while( true ) {
          iVar4 = (p->vObjFans).pArray[uVar12];
          lVar6 = (long)iVar4;
          if ((lVar6 < 0) || ((p->vFanSto).nSize <= iVar4)) goto LAB_0036ae7b;
          piVar5 = (p->vFanSto).pArray;
          if (piVar5[lVar6] <= lVar11) break;
          uVar9 = piVar5[lVar6 + lVar11 + 1];
          if ((long)(int)uVar9 < 1) goto LAB_0036aea3;
          uVar1 = (p->vObjCopy).nSize;
          if ((int)uVar1 < 1) goto LAB_0036ae9a;
          if (uVar1 <= uVar9) goto LAB_0036ae5c;
          iVar4 = (p->vObjCopy).pArray[(int)uVar9];
          if (((long)iVar4 < 0) || (pNtk_00->vObjs->nSize <= iVar4)) goto LAB_0036ae3d;
          Abc_ObjAddFanin(pAVar7,(Abc_Obj_t *)pNtk_00->vObjs->pArray[iVar4]);
          lVar11 = lVar11 + 1;
          if ((long)(p->vObjFans).nSize <= (long)uVar12) goto LAB_0036ae5c;
        }
        iVar4 = Abc_SopGetVarNum((char *)(pAVar7->field_5).pData);
        if (iVar4 != (pAVar7->vFanins).nSize) {
          __assert_fail("Abc_SopGetVarNum((char *)pObjNew->pData) == Abc_ObjFaninNum(pObjNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbAbc.c"
                        ,0x8c,"Abc_Ntk_t *Acb_NtkToAbc(Abc_Ntk_t *, Acb_Ntk_t *)");
        }
        iVar4 = (p->vObjType).nSize;
        lVar11 = (long)iVar4;
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < lVar11);
  }
  if (0 < (p->vCos).nSize) {
    lVar11 = 0;
    do {
      iVar4 = (p->vCos).pArray[lVar11];
      if ((long)iVar4 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p->vObjFans).nSize <= iVar4) {
LAB_0036ae5c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = (p->vObjFans).pArray[iVar4];
      if (((long)iVar4 < 0) || ((p->vFanSto).nSize <= iVar4)) {
LAB_0036ae7b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      if (pNtk_00->vCos->nSize <= lVar11) {
LAB_0036ae3d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar9 = (p->vFanSto).pArray[(long)iVar4 + 1];
      if ((int)uVar9 < 1) goto LAB_0036aea3;
      uVar1 = (p->vObjCopy).nSize;
      if ((int)uVar1 < 1) goto LAB_0036ae9a;
      if (uVar1 <= uVar9) goto LAB_0036ae5c;
      iVar4 = (p->vObjCopy).pArray[uVar9];
      if (((long)iVar4 < 0) || (pNtk_00->vObjs->nSize <= iVar4)) goto LAB_0036ae3d;
      Abc_ObjAddFanin((Abc_Obj_t *)pNtk_00->vCos->pArray[lVar11],
                      (Abc_Obj_t *)pNtk_00->vObjs->pArray[iVar4]);
      lVar11 = lVar11 + 1;
    } while (lVar11 < (p->vCos).nSize);
  }
  iVar4 = Abc_NtkCheck(pNtk_00);
  if (iVar4 == 0) {
    puts("Acb_NtkToAbc: The network check has failed.");
    Abc_NtkDelete(pNtk_00);
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  return pNtk_00;
LAB_0036aea3:
  pcVar8 = "i>0";
  goto LAB_0036aeaa;
LAB_0036ae9a:
  pcVar8 = "Acb_NtkHasObjCopies(p)";
LAB_0036aeaa:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Acb_NtkToAbc( Abc_Ntk_t * pNtk, Acb_Ntk_t * p )
{
    int i, k, iObj, iFanin;
    Abc_Ntk_t * pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    Mem_Flex_t * pMan = (Mem_Flex_t *)pNtkNew->pManFunc;
    Vec_Int_t * vCover = Vec_IntAlloc( 1000 );
    Acb_NtkCleanObjCopies( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetCopy( p, iObj, Abc_ObjId(Abc_NtkCi(pNtkNew, i)) );
    Acb_NtkForEachNode( p, iObj )
    {
        Abc_Obj_t * pObjNew = Abc_NtkCreateNode( pNtkNew );
        pObjNew->pData = Abc_SopCreateFromTruthIsop( pMan, Acb_ObjFaninNum(p, iObj), Acb_ObjTruthP(p, iObj), vCover );
        Acb_ObjSetCopy( p, iObj, Abc_ObjId(pObjNew) );
    }
    Vec_IntFree( vCover );
    Acb_NtkForEachNode( p, iObj )
    {
        Abc_Obj_t * pObjNew = Abc_NtkObj(pNtkNew, Acb_ObjCopy(p, iObj));
        Acb_ObjForEachFanin( p, iObj, iFanin, k )
            Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Acb_ObjCopy(p, iFanin)) );
        assert( Abc_SopGetVarNum((char *)pObjNew->pData) == Abc_ObjFaninNum(pObjNew) );
    }
    Acb_NtkForEachCoDriver( p, iFanin, i )
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), Abc_NtkObj(pNtkNew, Acb_ObjCopy(p, iFanin)) );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Acb_NtkToAbc: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}